

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluGLFunctionLoader.cpp
# Opt level: O2

FunctionLibrary * __thiscall eglu::GLLibraryCache::getLibrary(GLLibraryCache *this,ApiType apiType)

{
  int iVar1;
  iterator iVar2;
  undefined4 extraout_var;
  deUint32 key;
  deUint32 local_2c;
  pair<unsigned_int,_tcu::FunctionLibrary_*> local_28;
  _Base_ptr p_Var3;
  
  local_2c = apiType.m_bits;
  iVar2 = std::
          _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_tcu::FunctionLibrary_*>,_std::_Select1st<std::pair<const_unsigned_int,_tcu::FunctionLibrary_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_tcu::FunctionLibrary_*>_>_>
          ::find(&(this->m_libraries)._M_t,&local_2c);
  if ((_Rb_tree_header *)iVar2._M_node == &(this->m_libraries)._M_t._M_impl.super__Rb_tree_header) {
    iVar1 = (*this->m_platform->_vptr_Platform[2])(this->m_platform,apiType.m_bits,this->m_cmdLine);
    p_Var3 = (_Base_ptr)CONCAT44(extraout_var,iVar1);
    local_28.first = local_2c;
    local_28.second = (FunctionLibrary *)p_Var3;
    std::
    _Rb_tree<unsigned_int,std::pair<unsigned_int_const,tcu::FunctionLibrary*>,std::_Select1st<std::pair<unsigned_int_const,tcu::FunctionLibrary*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,tcu::FunctionLibrary*>>>
    ::_M_emplace_unique<std::pair<unsigned_int,tcu::FunctionLibrary*>>
              ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,tcu::FunctionLibrary*>,std::_Select1st<std::pair<unsigned_int_const,tcu::FunctionLibrary*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,tcu::FunctionLibrary*>>>
                *)&this->m_libraries,&local_28);
  }
  else {
    p_Var3 = iVar2._M_node[1]._M_parent;
  }
  return (FunctionLibrary *)p_Var3;
}

Assistant:

const tcu::FunctionLibrary* GLLibraryCache::getLibrary (glu::ApiType apiType)
{
	tcu::FunctionLibrary*	library	= DE_NULL;
	const deUint32			key		= apiType.getPacked();
	LibraryMap::iterator	iter	= m_libraries.find(key);

	if (iter == m_libraries.end())
	{
		library = m_platform.createDefaultGLFunctionLibrary(apiType, m_cmdLine);
		try
		{
			m_libraries.insert(std::make_pair(key, library));
		}
		catch (...)
		{
			delete library;
			throw;
		}
	}
	else
		library = iter->second;

	return library;
}